

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_manager.c
# Opt level: O2

apx_error_t
update_computation_list_on_port
          (adt_ary_t *list,adt_hash_t *map,apx_portInstance_t *port_instance,apx_port_t *parsed_port
          )

{
  bool bVar1;
  apx_computationListId_t computation_list_id;
  int32_t iVar2;
  apx_error_t aVar3;
  apx_typeAttributes_t *self;
  apx_computation_tag *paVar4;
  adt_str_t *other;
  char *pcVar5;
  apx_computationList_t *self_00;
  int iVar6;
  adt_str_t signature;
  
  computation_list_id = adt_ary_length(list);
  self = apx_port_get_referenced_type_attributes(parsed_port);
  iVar2 = apx_typeAttributes_num_computations(self);
  aVar3 = 0;
  if (0 < iVar2 && self != (apx_typeAttributes_t *)0x0) {
    adt_str_create(&signature);
    bVar1 = true;
    for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
      paVar4 = apx_typeAttributes_get_computation(self,iVar6);
      if (paVar4 == (apx_computation_tag *)0x0) {
        __assert_fail("computation != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                      ,0x2e2,
                      "apx_error_t update_computation_list_on_port(adt_ary_t *, adt_hash_t *, apx_portInstance_t *, const apx_port_t *)"
                     );
      }
      if (!bVar1) {
        adt_str_push(&signature,0x2c);
      }
      other = apx_computation_to_string(paVar4);
      if (other == (adt_str_t *)0x0) {
        aVar3 = 0x24;
        goto LAB_0012f379;
      }
      adt_str_append(&signature,other);
      adt_str_delete(other);
      bVar1 = false;
    }
    pcVar5 = adt_str_cstr(&signature);
    self_00 = (apx_computationList_t *)adt_hash_value(map,pcVar5);
    if (self_00 == (apx_computationList_t *)0x0) {
      self_00 = apx_computationList_new();
      if (self_00 == (apx_computationList_t *)0x0) {
        aVar3 = 2;
      }
      else {
        iVar6 = 0;
        do {
          if (iVar2 == iVar6) {
            apx_computationList_set_id(self_00,computation_list_id);
            pcVar5 = adt_str_cstr(&signature);
            adt_hash_set(map,pcVar5,self_00);
            adt_ary_push(list,self_00);
            goto LAB_0012f365;
          }
          paVar4 = apx_typeAttributes_get_computation(self,iVar6);
          if (paVar4 == (apx_computation_tag *)0x0) {
            __assert_fail("computation != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                          ,0x303,
                          "apx_error_t update_computation_list_on_port(adt_ary_t *, adt_hash_t *, apx_portInstance_t *, const apx_port_t *)"
                         );
          }
          aVar3 = apx_computationList_append_clone_of_computation(self_00,paVar4);
          iVar6 = iVar6 + 1;
        } while (aVar3 == 0);
      }
    }
    else {
LAB_0012f365:
      apx_portInstance_set_computation_list(port_instance,self_00);
      aVar3 = 0;
    }
LAB_0012f379:
    adt_str_destroy(&signature);
  }
  return aVar3;
}

Assistant:

static apx_error_t update_computation_list_on_port(adt_ary_t* list, adt_hash_t* map,
   apx_portInstance_t* port_instance, apx_port_t const* parsed_port)
{
   assert((port_instance != NULL) && (parsed_port != NULL));
   apx_size_t current_length = (apx_size_t)adt_ary_length(list);
   apx_typeAttributes_t* attributes = apx_port_get_referenced_type_attributes(parsed_port);
   int32_t const num_computations = apx_typeAttributes_num_computations(attributes);
   if ((attributes != NULL) && (num_computations > 0))
   {
      adt_str_t signature;
      apx_error_t retval = APX_NO_ERROR;
      bool first = true;
      int32_t i;
      adt_str_create(&signature);
      for (i=0; i < num_computations; i++)
      {
         apx_computation_t const* computation = apx_typeAttributes_get_computation(attributes, i);
         assert(computation != NULL);
         if (first)
         {
            first = false;
         }
         else
         {
            adt_str_push(&signature, ',');
         }
         adt_str_t* computation_str = apx_computation_to_string(computation);
         if (computation_str != NULL)
         {
            adt_str_append(&signature, computation_str);
            adt_str_delete(computation_str);
         }
         else
         {
            retval = APX_NULL_PTR_ERROR;
            break;
         }
      }
      if (retval == APX_NO_ERROR)
      {
         apx_computationList_t* computation_list = NULL;
         apx_computationList_t* existing_item = (apx_computationList_t*)adt_hash_value(map, adt_str_cstr(&signature));
         if (existing_item == NULL)
         {
            computation_list = apx_computationList_new();
            if (computation_list != NULL)
            {
               for (i = 0; i < num_computations; i++)
               {
                  apx_computation_t const* computation = apx_typeAttributes_get_computation(attributes, i);
                  assert(computation != NULL);
                  retval = apx_computationList_append_clone_of_computation(computation_list, computation);
                  if (retval != APX_NO_ERROR)
                  {
                     break;
                  }
               }
               if (retval == APX_NO_ERROR)
               {
                  apx_computationList_set_id(computation_list, current_length);
                  adt_hash_set(map, adt_str_cstr(&signature), computation_list);
                  adt_ary_push(list, computation_list);
               }
            }
            else
            {
               retval = APX_MEM_ERROR;
            }
         }
         else
         {
            computation_list = existing_item;
         }
         if (retval == APX_NO_ERROR)
         {
            apx_portInstance_set_computation_list(port_instance, computation_list);
         }
      }
      adt_str_destroy(&signature);
      return retval;
   }
   return APX_NO_ERROR;
}